

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaAddSchemaDoc
              (xmlSchemaParserCtxtPtr pctxt,int type,xmlChar *schemaLocation,xmlDocPtr schemaDoc,
              char *schemaBuffer,int schemaBufferLen,xmlNodePtr invokingNode,
              xmlChar *sourceTargetNamespace,xmlChar *importNamespace,
              xmlSchemaBucketPtr_conflict *bucket)

{
  xmlElementType xVar1;
  xmlDictPtr dict;
  xmlSchemaPtr pxVar2;
  xmlSchemaConstructionCtxtPtr pxVar3;
  xmlSchemaSchemaRelationPtr_conflict pxVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  xmlSchemaSchemaRelationPtr pxVar9;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr pxVar10;
  xmlErrorPtr pxVar11;
  xmlNodePtr node;
  byte *pbVar12;
  _xmlNode *p_Var13;
  xmlSchemaItemListPtr pxVar15;
  xmlSchemaSchemaRelationPtr_conflict pxVar16;
  xmlChar *pxVar17;
  xmlSchemaBucketPtr_conflict bucket_00;
  xmlSchemaBucketPtr_conflict pxVar18;
  xmlSchemaPtr pxVar19;
  xmlHashTablePtr pxVar20;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  xmlNodePtr pxVar21;
  xmlParserErrors xVar22;
  ulong uVar23;
  char *pcVar24;
  xmlNode *cur;
  undefined1 auVar25 [12];
  xmlChar *in_stack_ffffffffffffff80;
  xmlChar *local_60;
  xmlChar *local_40;
  undefined8 *puVar14;
  
  if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
    *bucket = (xmlSchemaBucketPtr_conflict)0x0;
  }
  if (type == 0) {
LAB_001ad6b6:
    pxVar9 = (xmlSchemaSchemaRelationPtr)0x0;
    bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
    local_40 = (xmlChar *)0x0;
LAB_001ad6c3:
    if (schemaDoc == (xmlDocPtr)0x0) {
      if (schemaBuffer != (char *)0x0 || schemaLocation != (xmlChar *)0x0) {
        pcVar24 = schemaBuffer;
        ctxt = xmlNewParserCtxt();
        local_60 = schemaLocation;
        if (ctxt == (xmlParserCtxtPtr)0x0) {
          pcVar24 = "xmlSchemaGetDoc, allocating a parser context";
          pxVar10 = (xmlDocPtr)0x0;
          __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,
                           "xmlSchemaGetDoc, allocating a parser context");
          iVar7 = 5;
          iVar8 = 0;
        }
        else {
          if ((pctxt->dict != (xmlDictPtr)0x0) && (ctxt->dict != (xmlDictPtr)0x0)) {
            xmlDictFree(ctxt->dict);
            dict = pctxt->dict;
            ctxt->dict = dict;
            xmlDictReference(dict);
          }
          if (schemaLocation == (xmlChar *)0x0) {
            if (schemaBuffer == (char *)0x0) {
              pxVar10 = (xmlDocPtr)0x0;
              local_60 = (xmlChar *)0x0;
            }
            else {
              pcVar24 = (char *)0x0;
              pxVar10 = xmlCtxtReadMemory(ctxt,schemaBuffer,schemaBufferLen,(char *)0x0,(char *)0x0,
                                          2);
              if (pxVar10 == (xmlDocPtr)0x0) {
                local_60 = "in_memory_buffer";
                pxVar10 = (xmlDocPtr)0x0;
              }
              else {
                local_60 = "in_memory_buffer";
                pxVar17 = xmlStrdup((xmlChar *)"in_memory_buffer");
                pxVar10->URL = pxVar17;
              }
            }
          }
          else {
            pxVar10 = xmlCtxtReadFile(ctxt,(char *)schemaLocation,(char *)0x0,2);
          }
          bVar6 = 0;
          iVar7 = 0;
          if (pxVar10 == (xmlDocPtr)0x0) {
            pxVar11 = xmlGetLastError();
            if (pxVar11 != (xmlErrorPtr)0x0) {
              bVar6 = 0;
              iVar7 = 0;
              if (pxVar11->domain == 8) goto LAB_001ad7fa;
            }
            pcVar24 = "Failed to parse the XML resource \'%s\'";
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_IMPORT_2_1,
                                invokingNode,(xmlSchemaBasicItemPtr)0x0,
                                "Failed to parse the XML resource \'%s\'",local_60,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
            iVar7 = 1;
            bVar6 = 1;
          }
LAB_001ad7fa:
          xmlFreeParserCtxt(ctxt);
          bVar5 = (bool)(pxVar10 == (xmlDocPtr)0x0 & bVar6);
          iVar8 = 1;
          if (!bVar5) {
            iVar8 = iVar7;
          }
          iVar7 = 0;
          if (bVar5) {
            iVar7 = 6;
          }
        }
        if (iVar7 == 0) {
          bVar5 = false;
          schemaBuffer = pcVar24;
          goto LAB_001ad849;
        }
        bVar5 = false;
        if (iVar7 == 5) goto LAB_001ada2f;
        if (iVar7 != 6) goto LAB_001ae10f;
LAB_001adc4c:
        if (((pxVar10 != (xmlDocPtr)0x0) && (!bVar5)) &&
           (xmlFreeDoc(pxVar10), bucket_00 != (xmlSchemaBucketPtr_conflict)0x0)) {
          bucket_00->doc = (xmlDocPtr)0x0;
        }
        invokingNode = (xmlNodePtr)(ulong)(uint)pctxt->err;
        goto LAB_001ae10f;
      }
      xmlSchemaPErr(pctxt,(xmlNodePtr)0x0,0x6de,
                    "No information for parsing was provided with the given schema parser context.\n"
                    ,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_001ada2d:
      pxVar10 = (xmlDocPtr)0x0;
LAB_001ada2f:
      bVar5 = false;
LAB_001ae0ef:
      invokingNode = (xmlNodePtr)0xffffffff;
      if (((pxVar10 != (xmlDocPtr)0x0) && (!bVar5)) &&
         (xmlFreeDoc(pxVar10), bucket_00 != (xmlSchemaBucketPtr_conflict)0x0)) {
        bucket_00->doc = (xmlDocPtr)0x0;
      }
      goto LAB_001ae10f;
    }
    bVar5 = true;
    iVar8 = 0;
    pxVar10 = schemaDoc;
    if (schemaDoc->URL == (xmlChar *)0x0) {
      local_60 = "in_memory_buffer";
    }
    else {
      local_60 = xmlDictLookup(pctxt->dict,schemaDoc->URL,-1);
    }
LAB_001ad849:
    if (pxVar10 != (xmlDoc *)0x0) {
      node = xmlDocGetRootElement(pxVar10);
      if (node == (xmlNodePtr)0x0) {
        schemaBuffer = "The document \'%s\' has no document element";
        xVar22 = XML_SCHEMAP_NOROOT;
        pxVar21 = invokingNode;
LAB_001ada58:
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar22,invokingNode,
                            (xmlSchemaBasicItemPtr)0x0,schemaBuffer,local_60,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0);
        iVar7 = 6;
      }
      else {
        cur = (xmlNodePtr)0x0;
        pxVar21 = node;
        do {
          if (cur != (xmlNodePtr)0x0) {
            xmlUnlinkNode(cur);
            xmlFreeNode(cur);
          }
          xVar1 = pxVar21->type;
          if (xVar1 == XML_ELEMENT_NODE) {
LAB_001ad8f6:
            cur = (xmlNode *)0x0;
LAB_001ad8f9:
            p_Var13 = pxVar21->children;
            if ((p_Var13 == (_xmlNode *)0x0) ||
               ((p_Var13->type < XML_NAMESPACE_DECL &&
                ((0x20060U >> (p_Var13->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0))))
            goto LAB_001ad910;
          }
          else {
            cur = (xmlNode *)0x0;
            if (xVar1 == XML_CDATA_SECTION_NODE) goto LAB_001ad8f9;
            cur = pxVar21;
            if (xVar1 == XML_TEXT_NODE) {
              pbVar12 = pxVar21->content;
              if (pbVar12 != (byte *)0x0) {
                for (; uVar23 = (ulong)*pbVar12, uVar23 < 0x21; pbVar12 = pbVar12 + 1) {
                  if ((0x100002600U >> (uVar23 & 0x3f) & 1) == 0) {
                    if (uVar23 == 0) goto LAB_001ad8df;
                    break;
                  }
                }
                goto LAB_001ad8f6;
              }
LAB_001ad8df:
              iVar8 = xmlNodeGetSpacePreserve(pxVar21);
              cur = (xmlNode *)0x0;
              if (iVar8 != 1) {
                cur = pxVar21;
              }
              goto LAB_001ad8f9;
            }
LAB_001ad910:
            do {
              p_Var13 = pxVar21->next;
              if (p_Var13 != (_xmlNode *)0x0) goto LAB_001ad929;
              pxVar21 = pxVar21->parent;
            } while ((pxVar21 != (xmlNodePtr)0x0) && (pxVar21 != node));
            p_Var13 = (_xmlNode *)0x0;
          }
LAB_001ad929:
          pxVar21 = p_Var13;
        } while (p_Var13 != (_xmlNode *)0x0);
        if (cur != (xmlNodePtr)0x0) {
          xmlUnlinkNode(cur);
          xmlFreeNode(cur);
        }
        pxVar21 = (xmlNodePtr)0x0;
        if (((node->ns == (xmlNs *)0x0) || (iVar8 = xmlStrEqual(node->name,"schema"), iVar8 == 0))
           || (iVar8 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar8 == 0)) {
          schemaBuffer = "The XML document \'%s\' is not a schema document";
          xVar22 = XML_SCHEMAP_NOT_SCHEMA;
          goto LAB_001ada58;
        }
        local_40 = xmlSchemaGetProp(pctxt,node,"targetNamespace");
        iVar7 = 0;
      }
      if (iVar7 == 6) goto LAB_001adc4c;
      iVar8 = 1;
      invokingNode = pxVar21;
      if (iVar7 != 0) goto LAB_001ae10f;
    }
    if ((bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) && (iVar8 != 0)) {
      pxVar2 = pctxt->constructor->mainSchema;
      if (pxVar2 == (xmlSchemaPtr)0x0) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBucketCreate",
                   "no main schema on constructor",(xmlChar *)0x0,(xmlChar *)schemaBuffer);
        bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
      }
      else {
        bucket_00 = (xmlSchemaBucketPtr_conflict)(*xmlMalloc)(0x58);
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema bucket");
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          bucket_00->origTargetNamespace = (xmlChar *)0x0;
          bucket_00->targetNamespace = (xmlChar *)0x0;
          bucket_00->type = 0;
          bucket_00->flags = 0;
          bucket_00->schemaLocation = (xmlChar *)0x0;
          bucket_00->globals = (xmlSchemaItemListPtr)0x0;
          bucket_00->locals = (xmlSchemaItemListPtr)0x0;
          bucket_00->located = 0;
          bucket_00->parsed = 0;
          bucket_00->imported = 0;
          bucket_00->preserveDoc = 0;
          bucket_00->doc = (xmlDocPtr)0x0;
          bucket_00->relations = (xmlSchemaSchemaRelationPtr_conflict)0x0;
          bucket_00[1].type = 0;
          bucket_00[1].flags = 0;
          bucket_00->targetNamespace = local_40;
          bucket_00->type = type;
          pxVar15 = xmlSchemaItemListCreate();
          bucket_00->globals = pxVar15;
          if (pxVar15 == (xmlSchemaItemListPtr)0x0) {
LAB_001add37:
            (*xmlFree)(bucket_00);
          }
          else {
            pxVar15 = xmlSchemaItemListCreate();
            bucket_00->locals = pxVar15;
            if (pxVar15 == (xmlSchemaItemListPtr)0x0) goto LAB_001add37;
            pxVar3 = pctxt->constructor;
            pxVar15 = pxVar3->buckets;
            if ((pxVar15 == (xmlSchemaItemListPtr)0x0) || (pxVar15->nbItems < 1)) {
              if ((type & 0xfffffffeU) == 2) {
                pcVar24 = "first bucket but it\'s an include or redefine";
                goto LAB_001ae06f;
              }
              bucket_00->type = 0;
              pxVar3->mainBucket = bucket_00;
              *(xmlSchemaPtr *)(bucket_00 + 1) = pxVar2;
              pxVar19 = pxVar2;
LAB_001adfff:
              pxVar19->targetNamespace = local_40;
LAB_001ae008:
              if (1 < (uint)type) {
                pxVar18 = pctxt->constructor->bucket;
                if (1 < (uint)pxVar18->type) {
                  pxVar18 = *(xmlSchemaBucketPtr_conflict *)(pxVar18 + 1);
                }
                *(xmlSchemaBucketPtr_conflict *)(bucket_00 + 1) = pxVar18;
                if (pxVar2->includes == (void *)0x0) {
                  pxVar15 = xmlSchemaItemListCreate();
                  pxVar2->includes = pxVar15;
                  if (pxVar15 == (xmlSchemaItemListPtr)0x0) goto LAB_001ae07b;
                }
                xmlSchemaItemListAdd((xmlSchemaItemListPtr)pxVar2->includes,bucket_00);
LAB_001ae168:
                iVar7 = xmlSchemaItemListAdd(pctxt->constructor->buckets,bucket_00);
                if (iVar7 == -1) {
                  bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
                }
                goto LAB_001ae085;
              }
              if (pxVar2->schemasImports != (xmlHashTablePtr)0x0) {
LAB_001ae03a:
                pxVar17 = (xmlChar *)"##";
                if (local_40 != (xmlChar *)0x0) {
                  pxVar17 = local_40;
                }
                iVar7 = xmlHashAddEntry(pxVar2->schemasImports,pxVar17,bucket_00);
                if (iVar7 != 0) {
                  pcVar24 = "failed to add the schema bucket to the hash";
                  goto LAB_001ae06f;
                }
                goto LAB_001ae168;
              }
              pxVar20 = xmlHashCreateDict(5,pctxt->constructor->dict);
              pxVar2->schemasImports = pxVar20;
              if (pxVar20 != (xmlHashTablePtr)0x0) goto LAB_001ae03a;
            }
            else {
              if (type == 1) {
                pxVar19 = xmlSchemaNewSchema(pctxt);
                *(xmlSchemaPtr *)(bucket_00 + 1) = pxVar19;
                if (pxVar19 != (xmlSchemaPtr)0x0) goto LAB_001adfff;
                goto LAB_001ae07b;
              }
              if (type != 0) goto LAB_001ae008;
              pcVar24 = "main bucket but it\'s not the first one";
LAB_001ae06f:
              xmlSchemaInternalErr2
                        ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBucketCreate",pcVar24,
                         (xmlChar *)0x0,(xmlChar *)schemaBuffer);
            }
LAB_001ae07b:
            xmlSchemaBucketFree(bucket_00);
          }
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
      }
LAB_001ae085:
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
        bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        goto LAB_001ae0ef;
      }
    }
    if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
      bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
    }
    else {
      bucket_00->schemaLocation = local_60;
      bucket_00->located = iVar8;
      if (pxVar10 != (xmlDoc *)0x0) {
        bucket_00->doc = pxVar10;
        bucket_00->targetNamespace = local_40;
        bucket_00->origTargetNamespace = local_40;
        if (schemaDoc != (xmlDocPtr)0x0) {
          bucket_00->preserveDoc = 1;
        }
      }
      if ((uint)type < 2) {
        bucket_00->imported = bucket_00->imported + 1;
      }
      if (pxVar9 != (xmlSchemaSchemaRelationPtr)0x0) {
LAB_001ae0d5:
        pxVar9->bucket = bucket_00;
      }
    }
  }
  else {
    pxVar15 = pctxt->constructor->buckets;
    if ((pxVar15 == (xmlSchemaItemListPtr)0x0) || (pxVar15->nbItems < 1)) goto LAB_001ad6b6;
    xVar22 = *(xmlParserErrors *)(&DAT_001fb380 + (long)type * 4);
    if (schemaLocation != (xmlChar *)0x0) {
      uVar23 = 0;
      do {
        bucket_00 = (xmlSchemaBucketPtr_conflict)pxVar15->items[uVar23];
        if (bucket_00->schemaLocation == schemaLocation) goto LAB_001ad68c;
        uVar23 = uVar23 + 1;
      } while ((uint)pxVar15->nbItems != uVar23);
      bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
LAB_001ad68c:
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) goto LAB_001ad9d7;
      if (pctxt->constructor->bucket != bucket_00) goto LAB_001ad9eb;
      pcVar24 = "The schema must not import/include/redefine itself";
      schemaLocation = (xmlChar *)0x0;
      goto LAB_001adfa3;
    }
LAB_001ad9d7:
    bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
LAB_001ad9eb:
    auVar25 = (undefined1  [12])(*xmlMalloc)(0x20);
    puVar14 = auVar25._0_8_;
    if (puVar14 == (undefined8 *)0x0) {
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema relation");
      auVar25._4_8_ = 0;
      auVar25._0_4_ = extraout_EDX;
      auVar25 = auVar25 << 0x40;
    }
    else {
      puVar14[2] = 0;
      puVar14[3] = 0;
      *puVar14 = 0;
      puVar14[1] = 0;
    }
    iVar8 = auVar25._8_4_;
    pxVar9 = auVar25._0_8_;
    if (pxVar9 == (xmlSchemaSchemaRelationPtr)0x0) {
      invokingNode = (xmlNodePtr)0xffffffff;
      goto LAB_001ae10f;
    }
    pxVar18 = pctxt->constructor->bucket;
    pxVar4 = pxVar18->relations;
    if (pxVar4 == (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      pxVar16 = (xmlSchemaSchemaRelationPtr_conflict)&pxVar18->relations;
    }
    else {
      do {
        pxVar16 = pxVar4;
        pxVar4 = pxVar16->next;
      } while (pxVar16->next != (xmlSchemaSchemaRelationPtr)0x0);
    }
    pxVar16->next = pxVar9;
    pxVar9->type = type;
    if (type != 1) {
      local_40 = (xmlChar *)0x0;
LAB_001adcbd:
      if (bucket_00 != (xmlSchemaBucketPtr_conflict)0x0) {
        if (type == 1) {
          if (bucket_00->imported == 0) {
            if (schemaLocation == (xmlChar *)0x0) {
              schemaLocation = (xmlChar *)"in_memory_buffer";
            }
            iVar7 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
            iVar8 = extraout_EDX_00;
            if (iVar7 == 0) {
              pcVar24 = 
              "The schema document \'%s\' cannot be imported, since it was already included or redefined"
              ;
LAB_001adfa3:
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,xVar22,invokingNode,
                                  (xmlSchemaBasicItemPtr)0x0,pcVar24,schemaLocation,(xmlChar *)0x0,
                                  (xmlChar *)0x0,(xmlChar *)0x0);
              goto LAB_001ae0dd;
            }
          }
        }
        else if (bucket_00->imported != 0) {
          if (schemaLocation == (xmlChar *)0x0) {
            schemaLocation = (xmlChar *)"in_memory_buffer";
          }
          iVar7 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
          iVar8 = extraout_EDX_01;
          if (iVar7 == 0) {
            pcVar24 = 
            "The schema document \'%s\' cannot be included or redefined, since it was already imported"
            ;
            goto LAB_001adfa3;
          }
        }
      }
      if (type != 1) {
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          if ((bucket_00->origTargetNamespace != (xmlChar *)0x0) ||
             (bucket_00->targetNamespace == sourceTargetNamespace)) goto LAB_001ae0d5;
          pxVar18 = xmlSchemaGetChameleonSchemaBucket(pctxt,schemaLocation,sourceTargetNamespace);
          if (pxVar18 != (xmlSchemaBucketPtr_conflict)0x0) {
            pxVar9->bucket = pxVar18;
            goto LAB_001ae0dd;
          }
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
LAB_001ae1b9:
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
          goto LAB_001ad6c3;
        }
        if (bucket_00->doc == (xmlDocPtr)0x0) goto LAB_001ad6c3;
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAddSchemaDoc",
                   "trying to load a schema doc, but a doc is already assigned to the schema bucket"
                   ,(xmlChar *)0x0,(xmlChar *)schemaBuffer);
        goto LAB_001ada2d;
      }
      if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
        bucket_00 = xmlSchemaGetSchemaBucketByTNS(pctxt,importNamespace,iVar8);
        if (bucket_00 == (xmlSchemaBucketPtr_conflict)0x0) {
          bucket_00 = (xmlSchemaBucketPtr_conflict)0x0;
        }
        else {
          pxVar9->bucket = bucket_00;
          if (bucket_00->schemaLocation != (xmlChar *)0x0) {
            iVar8 = xmlStrEqual(schemaLocation,bucket_00->schemaLocation);
            if (iVar8 == 0) {
              pxVar17 = (xmlChar *)"in_memory_buffer";
              if (schemaLocation != (xmlChar *)0x0) {
                pxVar17 = schemaLocation;
              }
              xmlSchemaCustomWarning
                        ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_SKIP_SCHEMA,invokingNode,
                         (xmlSchemaTypePtr)
                         "Skipping import of schema located at \'%s\' for the namespace \'%s\', since this namespace was already imported with the schema located at \'%s\'"
                         ,(char *)pxVar17,importNamespace,bucket_00->schemaLocation,
                         in_stack_ffffffffffffff80);
            }
            goto LAB_001ae0dd;
          }
          bucket_00->schemaLocation = schemaLocation;
        }
        goto LAB_001ae1b9;
      }
      goto LAB_001ae0d5;
    }
    pxVar9->importNamespace = importNamespace;
    local_40 = importNamespace;
    if (schemaLocation != (xmlChar *)0x0) goto LAB_001adcbd;
  }
LAB_001ae0dd:
  invokingNode = (xmlNodePtr)0x0;
  if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
    *bucket = bucket_00;
  }
LAB_001ae10f:
  return (int)invokingNode;
}

Assistant:

static int
xmlSchemaAddSchemaDoc(xmlSchemaParserCtxtPtr pctxt,
		int type, /* import or include or redefine */
		const xmlChar *schemaLocation,
		xmlDocPtr schemaDoc,
		const char *schemaBuffer,
		int schemaBufferLen,
		xmlNodePtr invokingNode,
		const xmlChar *sourceTargetNamespace,
		const xmlChar *importNamespace,
		xmlSchemaBucketPtr *bucket)
{
    const xmlChar *targetNamespace = NULL;
    xmlSchemaSchemaRelationPtr relation = NULL;
    xmlDocPtr doc = NULL;
    int res = 0, err = 0, located = 0, preserveDoc = 0;
    xmlSchemaBucketPtr bkt = NULL;

    if (bucket != NULL)
	*bucket = NULL;

    switch (type) {
	case XML_SCHEMA_SCHEMA_IMPORT:
	case XML_SCHEMA_SCHEMA_MAIN:
	    err = XML_SCHEMAP_SRC_IMPORT;
	    break;
	case XML_SCHEMA_SCHEMA_INCLUDE:
	    err = XML_SCHEMAP_SRC_INCLUDE;
	    break;
	case XML_SCHEMA_SCHEMA_REDEFINE:
	    err = XML_SCHEMAP_SRC_REDEFINE;
	    break;
    }


    /* Special handling for the main schema:
    * skip the location and relation logic and just parse the doc.
    * We need just a bucket to be returned in this case.
    */
    if ((type == XML_SCHEMA_SCHEMA_MAIN) || (! WXS_HAS_BUCKETS(pctxt)))
	goto doc_load;

    /* Note that we expect the location to be an absolute URI. */
    if (schemaLocation != NULL) {
	bkt = xmlSchemaGetSchemaBucket(pctxt, schemaLocation);
	if ((bkt != NULL) &&
	    (pctxt->constructor->bucket == bkt)) {
	    /* Report self-imports/inclusions/redefinitions. */

	    xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		invokingNode, NULL,
		"The schema must not import/include/redefine itself",
		NULL, NULL);
	    goto exit;
	}
    }
    /*
    * Create a relation for the graph of schemas.
    */
    relation = xmlSchemaSchemaRelationCreate();
    if (relation == NULL)
	return(-1);
    xmlSchemaSchemaRelationAddChild(pctxt->constructor->bucket,
	relation);
    relation->type = type;

    /*
    * Save the namespace import information.
    */
    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	relation->importNamespace = importNamespace;
	if (schemaLocation == NULL) {
	    /*
	    * No location; this is just an import of the namespace.
	    * Note that we don't assign a bucket to the relation
	    * in this case.
	    */
	    goto exit;
	}
	targetNamespace = importNamespace;
    }

    /* Did we already fetch the doc? */
    if (bkt != NULL) {
	if ((WXS_IS_BUCKET_IMPMAIN(type)) && (! bkt->imported)) {
	    /*
	    * We included/redefined and then try to import a schema,
	    * but the new location provided for import was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be imported, since "
		    "it was already included or redefined",
		    schemaLocation, NULL);
		goto exit;
	    }
	} else if ((! WXS_IS_BUCKET_IMPMAIN(type)) && (bkt->imported)) {
	    /*
	    * We imported and then try to include/redefine a schema,
	    * but the new location provided for the include/redefine
	    * was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be included or "
		    "redefined, since it was already imported",
		    schemaLocation, NULL);
		goto exit;
	    }
	}
    }

    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	/*
	* Given that the schemaLocation [attribute] is only a hint, it is open
	* to applications to ignore all but the first <import> for a given
	* namespace, regardless of the `actual value` of schemaLocation, but
	* such a strategy risks missing useful information when new
	* schemaLocations are offered.
	*
	* We will use the first <import> that comes with a location.
	* Further <import>s *with* a location, will result in an error.
	* TODO: Better would be to just report a warning here, but
	* we'll try it this way until someone complains.
	*
	* Schema Document Location Strategy:
	* 3 Based on the namespace name, identify an existing schema document,
	* either as a resource which is an XML document or a <schema> element
	* information item, in some local schema repository;
	* 5 Attempt to resolve the namespace name to locate such a resource.
	*
	* NOTE: (3) and (5) are not supported.
	*/
	if (bkt != NULL) {
	    relation->bucket = bkt;
	    goto exit;
	}
	bkt = xmlSchemaGetSchemaBucketByTNS(pctxt,
	    importNamespace, 1);

	if (bkt != NULL) {
	    relation->bucket = bkt;
	    if (bkt->schemaLocation == NULL) {
		/* First given location of the schema; load the doc. */
		bkt->schemaLocation = schemaLocation;
	    } else {
		if (!xmlStrEqual(schemaLocation,
		    bkt->schemaLocation)) {
		    /*
		    * Additional location given; just skip it.
		    * URGENT TODO: We should report a warning here.
		    * res = XML_SCHEMAP_SRC_IMPORT;
		    */
		    if (schemaLocation == NULL)
			schemaLocation = BAD_CAST "in_memory_buffer";

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_SKIP_SCHEMA,
			invokingNode, NULL,
			"Skipping import of schema located at '%s' for the "
			"namespace '%s', since this namespace was already "
			"imported with the schema located at '%s'",
			schemaLocation, importNamespace, bkt->schemaLocation);
		}
		goto exit;
	    }
	}
	/*
	* No bucket + first location: load the doc and create a
	* bucket.
	*/
    } else {
	/* <include> and <redefine> */
	if (bkt != NULL) {

	    if ((bkt->origTargetNamespace == NULL) &&
		(bkt->targetNamespace != sourceTargetNamespace)) {
		xmlSchemaBucketPtr chamel;

		/*
		* Chameleon include/redefine: skip loading only if it was
		* already build for the targetNamespace of the including
		* schema.
		*/
		/*
		* URGENT TODO: If the schema is a chameleon-include then copy
		* the components into the including schema and modify the
		* targetNamespace of those components, do nothing otherwise.
		* NOTE: This is currently worked-around by compiling the
		* chameleon for every distinct including targetNamespace; thus
		* not performant at the moment.
		* TODO: Check when the namespace in wildcards for chameleons
		* needs to be converted: before we built wildcard intersections
		* or after.
		*   Answer: after!
		*/
		chamel = xmlSchemaGetChameleonSchemaBucket(pctxt,
		    schemaLocation, sourceTargetNamespace);
		if (chamel != NULL) {
		    /* A fitting chameleon was already parsed; NOP. */
		    relation->bucket = chamel;
		    goto exit;
		}
		/*
		* We need to parse the chameleon again for a different
		* targetNamespace.
		* CHAMELEON TODO: Optimize this by only parsing the
		* chameleon once, and then copying the components to
		* the new targetNamespace.
		*/
		bkt = NULL;
	    } else {
		relation->bucket = bkt;
		goto exit;
	    }
	}
    }
    if ((bkt != NULL) && (bkt->doc != NULL)) {
	PERROR_INT("xmlSchemaAddSchemaDoc",
	    "trying to load a schema doc, but a doc is already "
	    "assigned to the schema bucket");
	goto exit_failure;
    }

doc_load:
    /*
    * Load the document.
    */
    if (schemaDoc != NULL) {
	doc = schemaDoc;
	/* Don' free this one, since it was provided by the caller. */
	preserveDoc = 1;
	/* TODO: Does the context or the doc hold the location? */
	if (schemaDoc->URL != NULL)
	    schemaLocation = xmlDictLookup(pctxt->dict,
		schemaDoc->URL, -1);
        else
	    schemaLocation = BAD_CAST "in_memory_buffer";
    } else if ((schemaLocation != NULL) || (schemaBuffer != NULL)) {
	xmlParserCtxtPtr parserCtxt;

	parserCtxt = xmlNewParserCtxt();
	if (parserCtxt == NULL) {
	    xmlSchemaPErrMemory(NULL, "xmlSchemaGetDoc, "
		"allocating a parser context", NULL);
	    goto exit_failure;
	}
	if ((pctxt->dict != NULL) && (parserCtxt->dict != NULL)) {
	    /*
	    * TODO: Do we have to burden the schema parser dict with all
	    * the content of the schema doc?
	    */
	    xmlDictFree(parserCtxt->dict);
	    parserCtxt->dict = pctxt->dict;
	    xmlDictReference(parserCtxt->dict);
	}
	if (schemaLocation != NULL) {
	    /* Parse from file. */
	    doc = xmlCtxtReadFile(parserCtxt, (const char *) schemaLocation,
		NULL, SCHEMAS_PARSE_OPTIONS);
	} else if (schemaBuffer != NULL) {
	    /* Parse from memory buffer. */
	    doc = xmlCtxtReadMemory(parserCtxt, schemaBuffer, schemaBufferLen,
		NULL, NULL, SCHEMAS_PARSE_OPTIONS);
	    schemaLocation = BAD_CAST "in_memory_buffer";
	    if (doc != NULL)
		doc->URL = xmlStrdup(schemaLocation);
	}
	/*
	* For <import>:
	* 2.1 The referent is (a fragment of) a resource which is an
	* XML document (see clause 1.1), which in turn corresponds to
	* a <schema> element information item in a well-formed information
	* set, which in turn corresponds to a valid schema.
	* TODO: (2.1) fragments of XML documents are not supported.
	*
	* 2.2 The referent is a <schema> element information item in
	* a well-formed information set, which in turn corresponds
	* to a valid schema.
	* TODO: (2.2) is not supported.
	*/
	if (doc == NULL) {
	    xmlErrorPtr lerr;
	    lerr = xmlGetLastError();
	    /*
	    * Check if this a parser error, or if the document could
	    * just not be located.
	    * TODO: Try to find specific error codes to react only on
	    * localisation failures.
	    */
	    if ((lerr == NULL) || (lerr->domain != XML_FROM_IO)) {
		/*
		* We assume a parser error here.
		*/
		located = 1;
		/* TODO: Error code ?? */
		res = XML_SCHEMAP_SRC_IMPORT_2_1;
		xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		    invokingNode, NULL,
		    "Failed to parse the XML resource '%s'",
		    schemaLocation, NULL);
	    }
	}
	xmlFreeParserCtxt(parserCtxt);
	if ((doc == NULL) && located)
	    goto exit_error;
    } else {
	xmlSchemaPErr(pctxt, NULL,
	    XML_SCHEMAP_NOTHING_TO_PARSE,
	    "No information for parsing was provided with the "
	    "given schema parser context.\n",
	    NULL, NULL);
	goto exit_failure;
    }
    /*
    * Preprocess the document.
    */
    if (doc != NULL) {
	xmlNodePtr docElem = NULL;

	located = 1;
	docElem = xmlDocGetRootElement(doc);
	if (docElem == NULL) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOROOT,
		invokingNode, NULL,
		"The document '%s' has no document element",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Remove all the blank text nodes.
	*/
	xmlSchemaCleanupDoc(pctxt, docElem);
	/*
	* Check the schema's top level element.
	*/
	if (!IS_SCHEMA(docElem, "schema")) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOT_SCHEMA,
		invokingNode, NULL,
		"The XML document '%s' is not a schema document",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Note that we don't apply a type check for the
	* targetNamespace value here.
	*/
	targetNamespace = xmlSchemaGetProp(pctxt, docElem,
	    "targetNamespace");
    }

/* after_doc_loading: */
    if ((bkt == NULL) && located) {
	/* Only create a bucket if the schema was located. */
        bkt = xmlSchemaBucketCreate(pctxt, type,
	    targetNamespace);
	if (bkt == NULL)
	    goto exit_failure;
    }
    if (bkt != NULL) {
	bkt->schemaLocation = schemaLocation;
	bkt->located = located;
	if (doc != NULL) {
	    bkt->doc = doc;
	    bkt->targetNamespace = targetNamespace;
	    bkt->origTargetNamespace = targetNamespace;
	    if (preserveDoc)
		bkt->preserveDoc = 1;
	}
	if (WXS_IS_BUCKET_IMPMAIN(type))
	    bkt->imported++;
	    /*
	    * Add it to the graph of schemas.
	    */
	if (relation != NULL)
	    relation->bucket = bkt;
    }

exit:
    /*
    * Return the bucket explicitly; this is needed for the
    * main schema.
    */
    if (bucket != NULL)
	*bucket = bkt;
    return (0);

exit_error:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return(pctxt->err);

exit_failure:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return (-1);
}